

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckCommand.cxx
# Opt level: O1

void __thiscall cmCTestMemCheckCommand::cmCTestMemCheckCommand(cmCTestMemCheckCommand *this)

{
  cmCTestTestCommand::cmCTestTestCommand(&this->super_cmCTestTestCommand);
  (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.super_cmCommand.
  _vptr_cmCommand = (_func_int **)&PTR__cmCTestHandlerCommand_006a3080;
  (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0x16] = "DEFECT_COUNT";
  (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0x17] = (char *)0x0;
  (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Last = 0x17;
  return;
}

Assistant:

cmCTestMemCheckCommand::cmCTestMemCheckCommand()
{
  this->Arguments[ctm_DEFECT_COUNT] = "DEFECT_COUNT";
  this->Arguments[ctm_LAST] = nullptr;
  this->Last = ctm_LAST;
}